

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O1

void __thiscall toml::source_location::source_location(source_location *this,location *loc)

{
  int iVar1;
  pointer pcVar2;
  _Alloc_hider __nptr;
  int *piVar3;
  ulong uVar4;
  size_t sVar5;
  undefined8 uVar6;
  long *unaff_R12;
  char *local_58;
  string local_50;
  
  detail::location::line_num_abi_cxx11_(&local_50,loc);
  __nptr._M_p = local_50._M_dataplus._M_p;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  uVar4 = strtoul(__nptr._M_p,&local_58,10);
  if (local_58 == __nptr._M_p) {
    uVar6 = std::__throw_invalid_argument("stoul");
    if (*(long **)piVar3 != unaff_R12) {
      operator_delete(*(long **)piVar3,*unaff_R12 + 1);
    }
    _Unwind_Resume(uVar6);
  }
  if (*piVar3 != 0) {
    if (*piVar3 != 0x22) goto LAB_001152e8;
    std::__throw_out_of_range("stoul");
  }
  *piVar3 = iVar1;
LAB_001152e8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->line_num_ = (uint_least32_t)uVar4;
  sVar5 = detail::location::before(loc);
  this->column_num_ = (int)sVar5 + 1;
  this->region_size_ = 1;
  (this->file_name_)._M_dataplus._M_p = (pointer)&(this->file_name_).field_2;
  pcVar2 = (loc->source_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file_name_,pcVar2,pcVar2 + (loc->source_name_)._M_string_length);
  detail::location::line_abi_cxx11_(&this->line_str_,loc);
  return;
}

Assistant:

explicit source_location(const detail::location& loc)
        : line_num_(static_cast<std::uint_least32_t>(std::stoul(loc.line_num()))),
          column_num_(static_cast<std::uint_least32_t>(loc.before() + 1)),
          region_size_(static_cast<std::uint_least32_t>(loc.size())),
          file_name_(loc.name()),
          line_str_ (loc.line())
    {}